

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O3

string * GetHIDUsagePageName_abi_cxx11_(string *__return_storage_ptr__,U16 usagePage)

{
  char *pcVar1;
  int iVar2;
  undefined6 in_register_00000032;
  char *pcVar3;
  string local_30;
  
  iVar2 = (int)CONCAT62(in_register_00000032,usagePage);
  switch(CONCAT62(in_register_00000032,usagePage) & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Undefined";
    pcVar1 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Generic Desktop Controls";
    pcVar1 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Simulation Controls";
    pcVar1 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "VR Controls";
    pcVar1 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Sport Controls";
    pcVar1 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Game Controls";
    pcVar1 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Generic Device Controls";
    pcVar1 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Keyboard/Keypad";
    pcVar1 = "";
    break;
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "LEDs";
    pcVar1 = "";
    break;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Button";
    pcVar1 = "";
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Ordinal";
    pcVar1 = "";
    break;
  case 0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Telephony";
    pcVar1 = "";
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Consumer";
    pcVar1 = "";
    break;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Digitizer";
    pcVar1 = "";
    break;
  case 0xe:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_00137136_caseD_e:
    if (usagePage < 0xff00) {
      int2str_sal_abi_cxx11_
                (&local_30,(ulong)usagePage,Hexadecimal,(uint)(0xff < usagePage) * 8 + 8);
      std::operator+(__return_storage_ptr__,"Reserved ",&local_30);
    }
    else {
      int2str_sal_abi_cxx11_(&local_30,(ulong)usagePage,Hexadecimal,0x10);
      std::operator+(__return_storage_ptr__,"Vendor Usage ",&local_30);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_30._M_dataplus._M_p);
    return __return_storage_ptr__;
  case 0xf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "PID Page";
    pcVar1 = "";
    break;
  case 0x10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Unicode";
    pcVar1 = "";
    break;
  case 0x14:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Alphanumeric Display";
    pcVar1 = "";
    break;
  default:
    switch(iVar2) {
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Monitor page";
      pcVar1 = "";
      break;
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Power page";
      pcVar1 = "";
      break;
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
      goto switchD_00137136_caseD_e;
    case 0x8c:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Bar Code Scanner page";
      pcVar1 = "";
      break;
    case 0x8d:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Scale page";
      pcVar1 = "";
      break;
    case 0x8e:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Magnetic Stripe Reading (MSR) Devices";
      pcVar1 = "";
      break;
    case 0x8f:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Reserved Point of Sale pages";
      pcVar1 = "";
      break;
    case 0x90:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Camera Control Page";
      pcVar1 = "";
      break;
    case 0x91:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Arcade Page";
      pcVar1 = "";
      break;
    default:
      if (iVar2 != 0x40) goto switchD_00137136_caseD_e;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Medical Instruments";
      pcVar1 = "";
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GetHIDUsagePageName( U16 usagePage )
{
    switch( usagePage )
    {
    case 0x00:
        return "Undefined";
    case 0x01:
        return "Generic Desktop Controls";
    case 0x02:
        return "Simulation Controls";
    case 0x03:
        return "VR Controls";
    case 0x04:
        return "Sport Controls";
    case 0x05:
        return "Game Controls";
    case 0x06:
        return "Generic Device Controls";
    case 0x07:
        return "Keyboard/Keypad";
    case 0x08:
        return "LEDs";
    case 0x09:
        return "Button";
    case 0x0A:
        return "Ordinal";
    case 0x0B:
        return "Telephony";
    case 0x0C:
        return "Consumer";
    case 0x0D:
        return "Digitizer";
    case 0x0F:
        return "PID Page";
    case 0x10:
        return "Unicode";
    case 0x14:
        return "Alphanumeric Display";
    case 0x40:
        return "Medical Instruments";
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
        return "Monitor page";
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
        return "Power page";
    case 0x8C:
        return "Bar Code Scanner page";
    case 0x8D:
        return "Scale page";
    case 0x8E:
        return "Magnetic Stripe Reading (MSR) Devices";
    case 0x8F:
        return "Reserved Point of Sale pages";
    case 0x90:
        return "Camera Control Page";
    case 0x91:
        return "Arcade Page";
    }

    if( usagePage >= 0xff00 )
        return "Vendor Usage " + int2str_sal( usagePage, Hexadecimal, 16 );

    return "Reserved " + int2str_sal( usagePage, Hexadecimal, usagePage > 0xff ? 16 : 8 );
}